

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O0

void examine_app0(j_decompress_ptr cinfo,JOCTET *data,uint datalen,JLONG remaining)

{
  char cVar1;
  long lVar2;
  undefined4 uVar3;
  long in_RCX;
  uint in_EDX;
  char *in_RSI;
  long *in_RDI;
  int *_mp;
  JLONG totallen;
  
  if ((((in_EDX < 0xe) || (*in_RSI != 'J')) || (in_RSI[1] != 'F')) ||
     (((in_RSI[2] != 'I' || (in_RSI[3] != 'F')) || (in_RSI[4] != '\0')))) {
    uVar3 = (undefined4)((ulong)in_EDX + in_RCX);
    if (((in_EDX < 6) || (*in_RSI != 'J')) ||
       ((in_RSI[1] != 'F' || (((in_RSI[2] != 'X' || (in_RSI[3] != 'X')) || (in_RSI[4] != '\0'))))))
    {
      *(undefined4 *)(*in_RDI + 0x28) = 0x4d;
      *(undefined4 *)(*in_RDI + 0x2c) = uVar3;
      (**(code **)(*in_RDI + 8))(in_RDI,1);
    }
    else {
      cVar1 = in_RSI[5];
      if (cVar1 == '\x10') {
        *(undefined4 *)(*in_RDI + 0x28) = 0x6c;
        *(undefined4 *)(*in_RDI + 0x2c) = uVar3;
        (**(code **)(*in_RDI + 8))(in_RDI,1);
      }
      else if (cVar1 == '\x11') {
        *(undefined4 *)(*in_RDI + 0x28) = 0x6d;
        *(undefined4 *)(*in_RDI + 0x2c) = uVar3;
        (**(code **)(*in_RDI + 8))(in_RDI,1);
      }
      else if (cVar1 == '\x13') {
        *(undefined4 *)(*in_RDI + 0x28) = 0x6e;
        *(undefined4 *)(*in_RDI + 0x2c) = uVar3;
        (**(code **)(*in_RDI + 8))(in_RDI,1);
      }
      else {
        *(undefined4 *)(*in_RDI + 0x28) = 0x59;
        *(uint *)(*in_RDI + 0x2c) = (uint)(byte)in_RSI[5];
        *(undefined4 *)(*in_RDI + 0x30) = uVar3;
        (**(code **)(*in_RDI + 8))(in_RDI,1);
      }
    }
  }
  else {
    *(undefined4 *)((long)in_RDI + 0x174) = 1;
    *(char *)(in_RDI + 0x2f) = in_RSI[5];
    *(char *)((long)in_RDI + 0x179) = in_RSI[6];
    *(char *)((long)in_RDI + 0x17a) = in_RSI[7];
    *(ushort *)((long)in_RDI + 0x17c) = (ushort)(byte)in_RSI[8] * 0x100 + (ushort)(byte)in_RSI[9];
    *(ushort *)((long)in_RDI + 0x17e) = (ushort)(byte)in_RSI[10] * 0x100 + (ushort)(byte)in_RSI[0xb]
    ;
    if ((char)in_RDI[0x2f] != '\x01') {
      *(undefined4 *)(*in_RDI + 0x28) = 0x77;
      *(uint *)(*in_RDI + 0x2c) = (uint)*(byte *)(in_RDI + 0x2f);
      *(uint *)(*in_RDI + 0x30) = (uint)*(byte *)((long)in_RDI + 0x179);
      (**(code **)(*in_RDI + 8))(in_RDI,0xffffffff);
    }
    lVar2 = *in_RDI;
    *(uint *)(lVar2 + 0x2c) = (uint)*(byte *)(in_RDI + 0x2f);
    *(uint *)(lVar2 + 0x30) = (uint)*(byte *)((long)in_RDI + 0x179);
    *(uint *)(lVar2 + 0x34) = (uint)*(ushort *)((long)in_RDI + 0x17c);
    *(uint *)(lVar2 + 0x38) = (uint)*(ushort *)((long)in_RDI + 0x17e);
    *(uint *)(lVar2 + 0x3c) = (uint)*(byte *)((long)in_RDI + 0x17a);
    *(undefined4 *)(*in_RDI + 0x28) = 0x57;
    (**(code **)(*in_RDI + 8))(in_RDI,1);
    if (in_RSI[0xc] != '\0' || in_RSI[0xd] != '\0') {
      *(undefined4 *)(*in_RDI + 0x28) = 0x5a;
      *(uint *)(*in_RDI + 0x2c) = (uint)(byte)in_RSI[0xc];
      *(uint *)(*in_RDI + 0x30) = (uint)(byte)in_RSI[0xd];
      (**(code **)(*in_RDI + 8))(in_RDI,1);
    }
    lVar2 = (ulong)in_EDX + in_RCX + -0xe;
    if (lVar2 != (ulong)(byte)in_RSI[0xc] * (ulong)(byte)in_RSI[0xd] * 3) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x58;
      *(int *)(*in_RDI + 0x2c) = (int)lVar2;
      (**(code **)(*in_RDI + 8))(in_RDI,1);
    }
  }
  return;
}

Assistant:

LOCAL(void)
examine_app0(j_decompress_ptr cinfo, JOCTET *data, unsigned int datalen,
             JLONG remaining)
/* Examine first few bytes from an APP0.
 * Take appropriate action if it is a JFIF marker.
 * datalen is # of bytes at data[], remaining is length of rest of marker data.
 */
{
  JLONG totallen = (JLONG)datalen + remaining;

  if (datalen >= APP0_DATA_LEN &&
      data[0] == 0x4A &&
      data[1] == 0x46 &&
      data[2] == 0x49 &&
      data[3] == 0x46 &&
      data[4] == 0) {
    /* Found JFIF APP0 marker: save info */
    cinfo->saw_JFIF_marker = TRUE;
    cinfo->JFIF_major_version = data[5];
    cinfo->JFIF_minor_version = data[6];
    cinfo->density_unit = data[7];
    cinfo->X_density = (data[8] << 8) + data[9];
    cinfo->Y_density = (data[10] << 8) + data[11];
    /* Check version.
     * Major version must be 1, anything else signals an incompatible change.
     * (We used to treat this as an error, but now it's a nonfatal warning,
     * because some bozo at Hijaak couldn't read the spec.)
     * Minor version should be 0..2, but process anyway if newer.
     */
    if (cinfo->JFIF_major_version != 1)
      WARNMS2(cinfo, JWRN_JFIF_MAJOR,
              cinfo->JFIF_major_version, cinfo->JFIF_minor_version);
    /* Generate trace messages */
    TRACEMS5(cinfo, 1, JTRC_JFIF,
             cinfo->JFIF_major_version, cinfo->JFIF_minor_version,
             cinfo->X_density, cinfo->Y_density, cinfo->density_unit);
    /* Validate thumbnail dimensions and issue appropriate messages */
    if (data[12] | data[13])
      TRACEMS2(cinfo, 1, JTRC_JFIF_THUMBNAIL, data[12], data[13]);
    totallen -= APP0_DATA_LEN;
    if (totallen != ((JLONG)data[12] * (JLONG)data[13] * (JLONG)3))
      TRACEMS1(cinfo, 1, JTRC_JFIF_BADTHUMBNAILSIZE, (int)totallen);
  } else if (datalen >= 6 &&
             data[0] == 0x4A &&
             data[1] == 0x46 &&
             data[2] == 0x58 &&
             data[3] == 0x58 &&
             data[4] == 0) {
    /* Found JFIF "JFXX" extension APP0 marker */
    /* The library doesn't actually do anything with these,
     * but we try to produce a helpful trace message.
     */
    switch (data[5]) {
    case 0x10:
      TRACEMS1(cinfo, 1, JTRC_THUMB_JPEG, (int)totallen);
      break;
    case 0x11:
      TRACEMS1(cinfo, 1, JTRC_THUMB_PALETTE, (int)totallen);
      break;
    case 0x13:
      TRACEMS1(cinfo, 1, JTRC_THUMB_RGB, (int)totallen);
      break;
    default:
      TRACEMS2(cinfo, 1, JTRC_JFIF_EXTENSION, data[5], (int)totallen);
      break;
    }
  } else {
    /* Start of APP0 does not match "JFIF" or "JFXX", or too short */
    TRACEMS1(cinfo, 1, JTRC_APP0, (int)totallen);
  }
}